

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_deflatev(ucvector *out,uchar *in,size_t insize,LodePNGCompressSettings *settings)

{
  LodePNGCompressSettings *in_RCX;
  ulong in_RDX;
  size_t in_RSI;
  ucvector *in_RDI;
  LodePNGBitWriter *unaff_retaddr;
  uint in_stack_00000010;
  size_t end;
  size_t start;
  uint final;
  LodePNGBitWriter writer;
  Hash hash;
  size_t numdeflateblocks;
  size_t blocksize;
  size_t i;
  uint error;
  uchar *in_stack_000000b0;
  Hash *in_stack_000000b8;
  LodePNGBitWriter *in_stack_000000c0;
  uint in_stack_000000d0;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  ucvector *in_stack_ffffffffffffff78;
  uchar *in_stack_ffffffffffffff80;
  ucvector *in_stack_ffffffffffffff88;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  uint local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  LodePNGBitWriter_init((LodePNGBitWriter *)&stack0xffffffffffffff78,in_RDI);
  if (in_RCX->btype < 3) {
    if (in_RCX->btype == 0) {
      local_2c = deflateNoCompression
                           (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                            (size_t)in_stack_ffffffffffffff78);
    }
    else {
      local_40 = in_RDX;
      if (in_RCX->btype != 1) {
        local_40 = (in_RDX >> 3) + 8;
        if (local_40 < 0x10000) {
          local_40 = 0x10000;
        }
        if (0x40000 < local_40) {
          local_40 = 0x40000;
        }
      }
      local_48 = ((in_RDX + local_40) - 1) / local_40;
      if (local_48 == 0) {
        local_48 = 1;
      }
      local_2c = hash_init((Hash *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
      if (local_2c == 0) {
        for (local_38 = 0; local_38 != local_48 && local_2c == 0; local_38 = local_38 + 1) {
          if (in_RCX->btype == 1) {
            local_2c = deflateFixed(unaff_retaddr,
                                    (Hash *)CONCAT44(in_stack_fffffffffffffffc,
                                                     in_stack_fffffffffffffff8),(uchar *)in_RDI,
                                    in_RSI,in_RDX,in_RCX,in_stack_00000010);
          }
          else if (in_RCX->btype == 2) {
            local_2c = deflateDynamic(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,
                                      (size_t)out,(size_t)in,(LodePNGCompressSettings *)insize,
                                      in_stack_000000d0);
          }
        }
      }
      hash_cleanup((Hash *)0x345ea0);
    }
  }
  else {
    local_2c = 0x3d;
  }
  return local_2c;
}

Assistant:

static unsigned lodepng_deflatev(ucvector* out, const unsigned char* in, size_t insize,
                                 const LodePNGCompressSettings* settings) {
  unsigned error = 0;
  size_t i, blocksize, numdeflateblocks;
  Hash hash;
  LodePNGBitWriter writer;

  LodePNGBitWriter_init(&writer, out);

  if(settings->btype > 2) return 61;
  else if(settings->btype == 0) return deflateNoCompression(out, in, insize);
  else if(settings->btype == 1) blocksize = insize;
  else /*if(settings->btype == 2)*/ {
    /*on PNGs, deflate blocks of 65-262k seem to give most dense encoding*/
    blocksize = insize / 8u + 8;
    if(blocksize < 65536) blocksize = 65536;
    if(blocksize > 262144) blocksize = 262144;
  }

  numdeflateblocks = (insize + blocksize - 1) / blocksize;
  if(numdeflateblocks == 0) numdeflateblocks = 1;

  error = hash_init(&hash, settings->windowsize);

  if(!error) {
    for(i = 0; i != numdeflateblocks && !error; ++i) {
      unsigned final = (i == numdeflateblocks - 1);
      size_t start = i * blocksize;
      size_t end = start + blocksize;
      if(end > insize) end = insize;

      if(settings->btype == 1) error = deflateFixed(&writer, &hash, in, start, end, settings, final);
      else if(settings->btype == 2) error = deflateDynamic(&writer, &hash, in, start, end, settings, final);
    }
  }

  hash_cleanup(&hash);

  return error;
}